

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft2d.c
# Opt level: O2

int fft2dInit(long M2,long M)

{
  int iVar1;
  float *pfVar2;
  
  if ((ulong)M2 < 0x40) {
    if (Array2d[M2] != (float *)0x0) {
LAB_00101577:
      iVar1 = fftInit(M);
      return iVar1;
    }
    pfVar2 = (float *)malloc(0x20L << (M2 & 0x3fU));
    Array2d[M2] = pfVar2;
    if (pfVar2 == (float *)0x0) {
      iVar1 = 2;
    }
    else {
      iVar1 = fftInit(M2);
      if (iVar1 == 0) goto LAB_00101577;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int fft2dInit(long M2, long M){
	// init for fft2d, ifft2d, rfft2d, and rifft2d
	// malloc storage for 4 columns of 2d ffts then call fftinit for both row and column ffts sizes
/* INPUTS */
/* M = log2 of number of columns */
/* M2 = log2 of number of rows */
/*       of 2d matrix to be fourier transformed */
/* OUTPUTS */
/* private storage for columns of 2d ffts	*/
/* calls fftInit for cosine and bit reversed tables	*/
int theError = 1;
if ((M2 >= 0) && (M2 < 8*sizeof(long))){
	theError = 0;
	if (Array2d[M2] == 0){
		Array2d[M2] = (float *) malloc( 4*2*POW2(M2)*sizeof(float) );
		if (Array2d[M2] == 0)
			theError = 2;
		else{
			theError = fftInit(M2);
		}
	}
	if (theError == 0)
		theError = fftInit(M);
}
return theError;
}